

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

void __thiscall
Simulator::simulation
          (Simulator *this,MultipleShootingCGMRES *cgmres_solver,VectorXd *initial_state_vec,
          double start_time,double end_time,double sampling_period,string *savefile_name)

{
  ostream *poVar1;
  rep rVar2;
  string *in_RCX;
  long in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double step_time;
  double current_time;
  double total_time;
  ofstream conditions_data;
  ofstream error_data;
  ofstream control_input_data;
  ofstream state_data;
  time_point end_clock;
  time_point start_clock;
  VectorXd control_input_vec;
  VectorXd next_state_vec;
  VectorXd current_state_vec;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffff568;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffff570;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffff578;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *in_stack_fffffffffffff580;
  char *in_stack_fffffffffffff590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff598;
  VectorXd *in_stack_fffffffffffff5a0;
  VectorXd *in_stack_fffffffffffff5a8;
  double in_stack_fffffffffffff5b0;
  ofstream *in_stack_fffffffffffff5b8;
  ofstream *in_stack_fffffffffffff5c0;
  ofstream *in_stack_fffffffffffff5c8;
  Simulator *in_stack_fffffffffffff5d0;
  duration<long,_std::ratio<1L,_1000000L>_> local_980;
  double local_978;
  undefined8 local_970;
  undefined8 local_950;
  double local_930;
  double local_928;
  string local_920 [32];
  ostream local_900 [48];
  VectorXd *in_stack_fffffffffffff730;
  double in_stack_fffffffffffff738;
  MultipleShootingCGMRES *in_stack_fffffffffffff740;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffff7b8;
  ostream *in_stack_fffffffffffff7c0;
  string local_700 [32];
  undefined1 local_6e0 [208];
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *in_stack_fffffffffffff9f0;
  VectorXd *in_stack_fffffffffffff9f8;
  double in_stack_fffffffffffffa00;
  double in_stack_fffffffffffffa08;
  MultipleShootingCGMRES *in_stack_fffffffffffffa10;
  string local_4e0 [32];
  undefined1 local_4c0 [512];
  string local_2c0 [32];
  undefined1 local_2a0 [296];
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *in_stack_fffffffffffffe88;
  double in_stack_fffffffffffffe90;
  VectorXd *in_stack_fffffffffffffe98;
  VectorXd *in_stack_fffffffffffffea0;
  double in_stack_fffffffffffffea8;
  NumericalIntegrator *in_stack_fffffffffffffeb0;
  
  NMPCModel::dimState((NMPCModel *)(in_RDI + 8));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff580,
             (int *)in_stack_fffffffffffff578);
  NMPCModel::dimState((NMPCModel *)(in_RDI + 8));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff580,
             (int *)in_stack_fffffffffffff578);
  NMPCModel::dimControlInput((NMPCModel *)(in_RDI + 8));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff580,
             (int *)in_stack_fffffffffffff578);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffff570);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffff570);
  std::operator+(in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::ofstream::ofstream(local_2a0,local_2c0,0x10);
  std::__cxx11::string::~string(local_2c0);
  std::operator+(in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::ofstream::ofstream(local_4c0,local_4e0,0x10);
  std::__cxx11::string::~string(local_4e0);
  std::operator+(in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::ofstream::ofstream(local_6e0,local_700,0x10);
  std::__cxx11::string::~string(local_700);
  std::operator+(in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::ofstream::ofstream(local_900,local_920,0x10);
  std::__cxx11::string::~string(local_920);
  local_928 = 0.0;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  poVar1 = std::operator<<((ostream *)&std::cout,"Start simulation");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_930 = in_XMM0_Qa; local_930 < in_XMM1_Qa; local_930 = in_XMM2_Qa + local_930) {
    MultipleShootingCGMRES::getError
              (in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff730);
    saveData(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
             in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,
             in_stack_fffffffffffff5a0,(double)in_stack_fffffffffffff598);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              (in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_stack_fffffffffffff570);
    NumericalIntegrator::rungeKuttaGill
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    local_950 = std::chrono::_V2::system_clock::now();
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              (in_stack_fffffffffffff580,in_stack_fffffffffffff578,in_stack_fffffffffffff570);
    MultipleShootingCGMRES::controlUpdate
              (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
               in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    std::operator<<((ostream *)&std::cout,"control_input_vec : ");
    poVar1 = Eigen::operator<<(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_970 = std::chrono::_V2::system_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffff578,
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffff570);
    local_980.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff568);
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_980);
    local_978 = (double)rVar2 * 1e-06;
    local_928 = local_928 + local_978;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              (in_stack_fffffffffffff570,in_stack_fffffffffffff568);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"End simulation");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Total CPU time for control update: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_928);
  poVar1 = std::operator<<(poVar1," [sec]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_900,"simulation name: ");
  poVar1 = std::operator<<(poVar1,in_RCX);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(local_900,"simulation time: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM1_Qa - in_XMM0_Qa);
  std::operator<<(poVar1," [sec]\n");
  poVar1 = std::operator<<(local_900,"CPU time for control update (total): ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_928);
  std::operator<<(poVar1," [sec]\n");
  poVar1 = std::operator<<(local_900,"sampling time: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM2_Qa);
  std::operator<<(poVar1," [sec]\n");
  poVar1 = std::operator<<(local_900,"CPU time for control update (1step): ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,local_928 / (double)(int)((in_XMM1_Qa - in_XMM0_Qa) / in_XMM2_Qa));
  std::operator<<(poVar1," [sec]\n");
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::~ofstream(local_900);
  std::ofstream::~ofstream(local_6e0);
  std::ofstream::~ofstream(local_4c0);
  std::ofstream::~ofstream(local_2a0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x177e8d);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x177e9a);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x177ea7);
  return;
}

Assistant:

void Simulator::simulation(MultipleShootingCGMRES cgmres_solver, const Eigen::VectorXd& initial_state_vec, const double start_time, const double end_time, const double sampling_period, const std::string savefile_name)
{
    Eigen::VectorXd current_state_vec(model_.dimState()), next_state_vec(model_.dimState()), control_input_vec(model_.dimControlInput());
    std::chrono::system_clock::time_point start_clock, end_clock;

    std::ofstream state_data(savefile_name + "_state.dat");
    std::ofstream control_input_data(savefile_name + "_control_input.dat");
    std::ofstream error_data(savefile_name + "_error.dat");
    std::ofstream conditions_data(savefile_name + "_conditions.dat");

    double total_time = 0;
    current_state_vec = initial_state_vec;
    std::cout << "Start simulation" << std::endl;
    for(double current_time=start_time; current_time<end_time; current_time+= sampling_period){
        saveData(state_data, control_input_data, error_data, current_time, current_state_vec, control_input_vec, cgmres_solver.getError(current_time, current_state_vec));

        // Compute the next state vector using the 4th Runge-Kutta-Gill method.
        rungeKuttaGill(current_time, current_state_vec, control_input_vec, sampling_period, next_state_vec);

        // Update the solution and measure computational time.
        start_clock = std::chrono::system_clock::now();
        cgmres_solver.controlUpdate(current_time, sampling_period, current_state_vec, control_input_vec);
        std::cout << "control_input_vec : " << control_input_vec << std::endl;

        end_clock = std::chrono::system_clock::now();

        // Convert computational time to seconds.
        double step_time = std::chrono::duration_cast<std::chrono::microseconds>(end_clock-start_clock).count();
        step_time *= 1e-06;
        total_time += step_time;

        current_state_vec = next_state_vec;
    }
    std::cout << "End simulation" << std::endl;
    std::cout << "Total CPU time for control update: " << total_time << " [sec]" << std::endl;

    // Save simulation conditions.
    conditions_data << "simulation name: " << savefile_name << "\n";
    conditions_data << "simulation time: " << end_time-start_time << " [sec]\n";
    conditions_data << "CPU time for control update (total): " << total_time << " [sec]\n";
    conditions_data << "sampling time: " << sampling_period << " [sec]\n";
    conditions_data << "CPU time for control update (1step): " << total_time/((int)( (end_time-start_time)/(sampling_period))) << " [sec]\n";

    state_data.close();
    control_input_data.close();
    error_data.close();
    conditions_data.close();
}